

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

bool __thiscall
option::PrintUsageImplementation::LinePartIterator::nextTable(LinePartIterator *this)

{
  Descriptor *pDVar1;
  char *pcVar2;
  
  pDVar1 = this->tablestart;
  if (this->rowdesc != (Descriptor *)0x0) {
    pcVar2 = pDVar1->help;
    while ((pcVar2 != (char *)0x0 && (pDVar1->shortopt != (char *)0x0))) {
      this->tablestart = pDVar1 + 1;
      pcVar2 = pDVar1[1].help;
      pDVar1 = pDVar1 + 1;
    }
  }
  pcVar2 = pDVar1->help;
  do {
    if (pcVar2 != (char *)0x0) {
LAB_00112d31:
      this->rowdesc = pDVar1;
      this->rowstart = pcVar2;
      this->ptr = (char *)0x0;
      return pcVar2 != (char *)0x0;
    }
    if (pDVar1->shortopt == (char *)0x0) {
      pcVar2 = (char *)0x0;
      goto LAB_00112d31;
    }
    this->tablestart = pDVar1 + 1;
    pcVar2 = pDVar1[1].help;
    pDVar1 = pDVar1 + 1;
  } while( true );
}

Assistant:

bool nextTable()
    {
      // If this is NOT the first time nextTable() is called after the constructor,
      // then skip to the next table break (i.e. a Descriptor with help == 0)
      if (rowdesc != 0)
      {
        while (tablestart->help != 0 && tablestart->shortopt != 0)
          ++tablestart;
      }

      // Find the next table after the break (if any)
      while (tablestart->help == 0 && tablestart->shortopt != 0)
        ++tablestart;

      restartTable();
      return rowstart != 0;
    }